

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::percent_str_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,index_t num,index_t denom)

{
  double x;
  uint local_9c;
  double local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  local_9c = (uint)this;
  if (num == 0) {
    GEO::String::to_string<unsigned_int>(__return_storage_ptr__,&local_9c);
  }
  else {
    local_98 = ((double)((ulong)this & 0xffffffff) / (double)num) * 100.0;
    GEO::String::to_string<unsigned_int>(&local_30,&local_9c);
    std::operator+(&local_70,&local_30,"(");
    GEO::String::to_string<double>(&local_90,&local_98);
    std::operator+(&local_50,&local_70,&local_90);
    std::operator+(__return_storage_ptr__,&local_50,"%)");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string percent_str(index_t num, index_t denom) {
        if(denom == 0) {
            return String::to_string(num);
        }
        double x = double(num) / double(denom) * 100.0;
        return String::to_string(num) + "(" + String::to_string(x) + "%)";
    }